

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_time_time2str(time_t time,char *fractions_s,char **str)

{
  int iVar1;
  tm *ptVar2;
  char *pcVar3;
  char *local_d0;
  uint local_9c;
  int zonediff_m;
  int zonediff_h;
  int zonediff_s;
  char zoneshift [12];
  tm tm;
  char **str_local;
  char *fractions_s_local;
  time_t time_local;
  
  fractions_s_local = (char *)time;
  if (str == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","str","ly_time_time2str");
    time_local._4_4_ = LY_EINVAL;
  }
  else {
    tzset();
    ptVar2 = localtime_r((time_t *)&fractions_s_local,(tm *)(zoneshift + 4));
    if (ptVar2 == (tm *)0x0) {
      time_local._4_4_ = LY_ESYS;
    }
    else {
      iVar1 = ly_time_tz_offset_at((time_t)fractions_s_local);
      local_9c = (uint)((long)((ulong)(uint)((int)((long)iVar1 / 0x3c) >> 0x1f) << 0x20 |
                              (long)iVar1 / 0x3c & 0xffffffffU) % 0x3c);
      if ((int)local_9c < 0) {
        local_9c = -local_9c;
      }
      sprintf((char *)&zonediff_h,"%+03d:%02d",
              (long)((ulong)(uint)((int)((long)iVar1 / 0x3c) >> 0x1f) << 0x20 |
                    (long)iVar1 / 0x3c & 0xffffffffU) / 0x3c & 0xffffffff,(ulong)local_9c);
      pcVar3 = "";
      if (fractions_s == (char *)0x0) {
        local_d0 = "";
      }
      else {
        pcVar3 = ".";
        local_d0 = fractions_s;
      }
      iVar1 = asprintf(str,"%04d-%02d-%02dT%02d:%02d:%02d%s%s%s",(ulong)(tm.tm_mday + 0x76c),
                       (ulong)(tm.tm_hour + 1),(ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,
                       zoneshift._8_4_,zoneshift._4_4_,pcVar3,local_d0,&zonediff_h);
      if (iVar1 == -1) {
        time_local._4_4_ = LY_EMEM;
      }
      else {
        time_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return time_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_time_time2str(time_t time, const char *fractions_s, char **str)
{
    struct tm tm;
    char zoneshift[12];
    int zonediff_s, zonediff_h, zonediff_m;

    LY_CHECK_ARG_RET(NULL, str, LY_EINVAL);

    /* init timezone */
    tzset();

    /* convert */
    if (!localtime_r(&time, &tm)) {
        return LY_ESYS;
    }

    /* get timezone offset (do not use tm_gmtoff to avoid portability problems),
     * zonediff_h may be negative, zonediff_m MUST NOT */
    zonediff_s = ly_time_tz_offset_at(time);
    zonediff_h = zonediff_s / 60 / 60;
    zonediff_m = zonediff_s / 60 % 60;
    sprintf(zoneshift, "%+03d:%02d", zonediff_h, zonediff_m < 0 ? -zonediff_m : zonediff_m);

    /* print */
    if (asprintf(str, "%04d-%02d-%02dT%02d:%02d:%02d%s%s%s",
            tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday, tm.tm_hour, tm.tm_min, tm.tm_sec,
            fractions_s ? "." : "", fractions_s ? fractions_s : "", zoneshift) == -1) {
        return LY_EMEM;
    }

    return LY_SUCCESS;
}